

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void codearith(FuncState *fs,BinOpr opr,expdesc *e1,expdesc *e2,int flip,int line)

{
  int iVar1;
  
  if ((e2->t == e2->f) && (0xfffffffd < e2->k - VKSTR)) {
    iVar1 = luaK_exp2K(fs,e2);
    if (iVar1 != 0) {
      finishbinexpval(fs,e1,e2,opr + (OPR_OR|OPR_MUL),(e2->u).info,flip,line,OP_MMBINK,
                      opr + OPR_IDIV);
      return;
    }
  }
  codebinNoK(fs,opr,e1,e2,flip,line);
  return;
}

Assistant:

static void codearith (FuncState *fs, BinOpr opr,
                       expdesc *e1, expdesc *e2, int flip, int line) {
  if (tonumeral(e2, NULL) && luaK_exp2K(fs, e2))  /* K operand? */
    codebinK(fs, opr, e1, e2, flip, line);
  else  /* 'e2' is neither an immediate nor a K operand */
    codebinNoK(fs, opr, e1, e2, flip, line);
}